

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

Maybe<kj::Own<const_kj::File>_> __thiscall
kj::anon_unknown_35::InMemoryDirectory::asFile
          (InMemoryDirectory *this,Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *lock,
          EntryImpl *entry,WriteMode mode)

{
  Mutex *this_00;
  undefined8 *puVar1;
  Own<const_kj::File> OVar2;
  Own<const_kj::File> OVar3;
  long *plVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined8 uVar6;
  Disposer *extraout_RAX;
  undefined4 in_register_0000000c;
  long lVar7;
  String *pSVar8;
  File *extraout_RDX;
  File *extraout_RDX_00;
  File *extraout_RDX_01;
  File *pFVar9;
  File *extraout_RDX_02;
  ulong in_R8;
  String *ptrCopy;
  Own<const_kj::File> OVar10;
  PathPtr path;
  Fault f_1;
  Fault f;
  Path local_58;
  Fault local_40;
  long *local_38;
  
  lVar7 = CONCAT44(in_register_0000000c,mode);
  iVar5 = *(int *)(lVar7 + 0x18);
  if (iVar5 == 0) {
    if ((in_R8 & 1) == 0) {
      local_40.exception = (Exception *)0x0;
      local_58.parts.ptr = (String *)0x0;
      local_58.parts.size_ = 0;
      _::Debug::Fault::init
                (&local_40,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                );
      _::Debug::Fault::fatal(&local_40);
    }
    puVar1 = (undefined8 *)(entry->name).content.size_;
    uVar6 = (*(code *)**(undefined8 **)*puVar1)();
    puVar1[7] = uVar6;
    newInMemoryFile((kj *)&local_40,*(Clock **)(entry->name).content.size_);
    plVar4 = local_38;
    local_38 = (long *)0x0;
    if (((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
          *)(lVar7 + 0x18))->tag != 0) {
      OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
      ::destroy((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                 *)(lVar7 + 0x18));
    }
    *(Exception **)(lVar7 + 0x20) = local_40.exception;
    *(long **)(lVar7 + 0x28) = plVar4;
    *(undefined4 *)(lVar7 + 0x18) = 1;
    (**(code **)(*plVar4 + 0x28))(&local_58,plVar4);
    pFVar9 = extraout_RDX_01;
  }
  else {
    if (iVar5 == 3) {
      SymlinkNode::parse(&local_58,(SymlinkNode *)(lVar7 + 0x20));
      this_00 = (Mutex *)(entry->name).content.ptr;
      if (this_00 != (Mutex *)0x0) {
        _::Mutex::unlock(this_00,EXCLUSIVE);
      }
      (entry->name).content.ptr = (char *)0x0;
      (entry->name).content.size_ = 0;
      path.parts.size_ = (size_t)local_58.parts.ptr;
      path.parts.ptr = (String *)lock;
      OVar10 = (Own<const_kj::File>)tryOpenFile(this,path,(WriteMode)local_58.parts.size_);
      if (local_58.parts.ptr == (String *)0x0) {
        return (Maybe<kj::Own<const_kj::File>_>)OVar10;
      }
      iVar5 = (**(local_58.parts.disposer)->_vptr_ArrayDisposer)
                        (local_58.parts.disposer,local_58.parts.ptr,0x18,local_58.parts.size_,
                         local_58.parts.size_,ArrayDisposer::Dispose_<kj::String,_false>::destruct);
      OVar10.disposer._4_4_ = extraout_var;
      OVar10.disposer._0_4_ = iVar5;
      OVar10.ptr = extraout_RDX_00;
      return (Maybe<kj::Own<const_kj::File>_>)OVar10;
    }
    if (iVar5 != 1) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[11]>
                ((Fault *)&local_58,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x664,FAILED,(char *)0x0,"\"not a file\"",(char (*) [11])"not a file");
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
      (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
      _::Debug::Fault::~Fault((Fault *)&local_58);
      OVar3.ptr = extraout_RDX_02;
      OVar3.disposer = extraout_RAX;
      return (Maybe<kj::Own<const_kj::File>_>)OVar3;
    }
    (**(code **)(**(long **)(lVar7 + 0x28) + 0x28))(&local_58);
    pFVar9 = extraout_RDX;
  }
  OVar2.ptr = pFVar9;
  OVar2.disposer = (Disposer *)local_58.parts.size_;
  pSVar8 = (String *)local_58.parts.size_;
  if ((String *)local_58.parts.size_ != (String *)0x0) {
    pSVar8 = local_58.parts.ptr;
  }
  (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)pSVar8;
  (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)local_58.parts.size_;
  return (Maybe<kj::Own<const_kj::File>_>)OVar2;
}

Assistant:

Maybe<Own<const File>> asFile(kj::Locked<Impl>& lock, EntryImpl& entry, WriteMode mode) const {
    if (entry.node.is<FileNode>()) {
      return entry.node.get<FileNode>().file->clone();
    } else if (entry.node.is<SymlinkNode>()) {
      // CREATE_PARENT doesn't apply to creating the parents of a symlink target. However, the
      // target itself can still be created.
      auto newPath = entry.node.get<SymlinkNode>().parse();
      lock.release();
      return tryOpenFile(newPath, mode - WriteMode::CREATE_PARENT);
    } else if (entry.node == nullptr) {
      KJ_ASSERT(has(mode, WriteMode::CREATE));
      lock->modified();
      return entry.init(FileNode { newInMemoryFile(lock->clock) });
    } else {
      KJ_FAIL_REQUIRE("not a file") { return nullptr; }
    }
  }